

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.h
# Opt level: O0

void __thiscall
mocker::LoopInvariantCodeMotion::~LoopInvariantCodeMotion(LoopInvariantCodeMotion *this)

{
  LoopInvariantCodeMotion *this_local;
  
  ~LoopInvariantCodeMotion(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

LoopInvariantCodeMotion(ir::FunctionModule &func, const FuncAttr &funcAttr)
      : FuncPass(func), funcAttr(funcAttr) {}